

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

void internal_exr_destroy_parts(_internal_exr_context *ctxt)

{
  exr_attribute_t *peVar1;
  undefined1 *__s;
  _internal_exr_part *in_RDI;
  _internal_exr_context *unaff_retaddr;
  _internal_exr_part *cur;
  int p;
  exr_memory_free_func_t dofree;
  int local_14;
  
  peVar1 = in_RDI->tiles;
  for (local_14 = 0; local_14 < in_RDI->num_tile_levels_y; local_14 = local_14 + 1) {
    __s = *(undefined1 **)(in_RDI[1].tile_level_tile_count_y + (long)local_14 * 2);
    internal_exr_destroy_part(unaff_retaddr,in_RDI);
    if ((int32_t **)__s == &in_RDI->tile_level_tile_count_x) {
      memset(__s,0,0x108);
    }
    else {
      (*(code *)peVar1)(__s);
    }
  }
  if (1 < in_RDI->num_tile_levels_y) {
    (*(code *)peVar1)(in_RDI[1].tile_level_tile_count_y);
  }
  in_RDI[1].tile_level_tile_count_y = (int32_t *)0x0;
  in_RDI->num_tile_levels_y = 0;
  return;
}

Assistant:

static void
internal_exr_destroy_parts (struct _internal_exr_context* ctxt)
{
    exr_memory_free_func_t dofree = ctxt->free_fn;
    for (int p = 0; p < ctxt->num_parts; ++p)
    {
        struct _internal_exr_part* cur = ctxt->parts[p];

        internal_exr_destroy_part (ctxt, cur);

        /* the first one is always the one that is part of the file */
        if (cur != &(ctxt->first_part)) { dofree (cur); }
        else
        {
            memset (cur, 0, sizeof (struct _internal_exr_part));
        }
    }

    if (ctxt->num_parts > 1) dofree (ctxt->parts);
    ctxt->parts     = NULL;
    ctxt->num_parts = 0;
}